

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

void __thiscall QString::QString(QString *this,QChar ch)

{
  char16_t *pcVar1;
  QArrayDataPointer<char16_t> *in_RDI;
  long in_FS_OFFSET;
  undefined6 in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc6;
  char16_t cVar2;
  QArrayDataPointer<char16_t> *n;
  qsizetype in_stack_ffffffffffffffd8;
  QArrayDataPointer<char16_t> *in_stack_ffffffffffffffe0;
  QChar local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  n = in_RDI;
  QArrayDataPointer<char16_t>::QArrayDataPointer(in_RDI);
  QArrayDataPointer<char16_t>::QArrayDataPointer
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(qsizetype)n,
             (AllocationOption)((ulong)in_RDI >> 0x20));
  QArrayDataPointer<char16_t>::operator=
            (in_RDI,(QArrayDataPointer<char16_t> *)
                    CONCAT26(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0));
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)
             CONCAT26(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0));
  qt_noop();
  pcVar1 = QChar::unicode(&local_a);
  cVar2 = *pcVar1;
  pcVar1 = QArrayDataPointer<char16_t>::data(in_RDI);
  *pcVar1 = cVar2;
  pcVar1 = QArrayDataPointer<char16_t>::data(in_RDI);
  pcVar1[1] = L'\0';
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QString::QString(QChar ch)
{
    d = DataPointer(1, 1);
    Q_CHECK_PTR(d.data());
    d.data()[0] = ch.unicode();
    d.data()[1] = '\0';
}